

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,string_view value)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  
  cmStateSnapshot::SetDefinition(&this->StateSnapshot,name,value);
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  if ((pcVar1 != (cmake *)0x0) &&
     (this_00 = (pcVar1->VariableWatch)._M_t.
                super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t.
                super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
                super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,
     this_00 != (cmVariableWatch *)0x0)) {
    cmVariableWatch::VariableAccessed(this_00,name,3,value._M_str,this);
    return;
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, cm::string_view value)
{
  this->StateSnapshot.SetDefinition(name, value);

#ifndef CMAKE_BOOTSTRAP
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value.data(), this);
  }
#endif
}